

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O0

void __thiscall webrtc::NonlinearBeamformer::InitTargetCovMats(NonlinearBeamformer *this)

{
  ulong local_18;
  size_t i;
  NonlinearBeamformer *this_local;
  
  for (local_18 = 0; local_18 < 0x81; local_18 = local_18 + 1) {
    Matrix<std::complex<float>_>::Resize
              (&this->target_cov_mats_[local_18].super_Matrix<std::complex<float>_>,
               this->num_input_channels_,this->num_input_channels_);
    anon_unknown_9::TransposedConjugatedProduct
              (this->delay_sum_masks_ + local_18,this->target_cov_mats_ + local_18);
  }
  return;
}

Assistant:

void NonlinearBeamformer::InitTargetCovMats() {
  for (size_t i = 0; i < kNumFreqBins; ++i) {
    target_cov_mats_[i].Resize(num_input_channels_, num_input_channels_);
    TransposedConjugatedProduct(delay_sum_masks_[i], &target_cov_mats_[i]);
  }
}